

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugInfoEntry.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFDebugInfoEntry::extractFast
          (DWARFDebugInfoEntry *this,DWARFUnit *U,uint64_t *OffsetPtr,
          DWARFDataExtractor *DebugInfoData,uint64_t UEndOffset,uint32_t D)

{
  Form Form;
  DataExtractor DebugInfoData_00;
  bool bVar1;
  uint64_t uVar2;
  DWARFAbbreviationDeclaration *pDVar3;
  unsigned_long *puVar4;
  AttributeSpec *pAVar5;
  long *plVar6;
  FormParams *pFVar7;
  Optional<unsigned_long> OVar8;
  Optional<long> OVar9;
  anon_union_8_2_fc7899a5_for_OptionalStorage<long,_true>_2 local_a0;
  Optional<long> FixedSize_1;
  AttributeSpec *AttrSpec;
  AttributeSpec *__end1;
  AttributeSpec *__begin1;
  iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*> *local_68;
  attr_iterator_range *__range1;
  Optional<unsigned_long> FixedSize;
  DWARFAbbreviationDeclarationSet *Abbreviations;
  uint64_t AbbrCode;
  uint32_t D_local;
  uint64_t UEndOffset_local;
  DWARFDataExtractor *DebugInfoData_local;
  uint64_t *OffsetPtr_local;
  DWARFUnit *U_local;
  DWARFDebugInfoEntry *this_local;
  
  this->Offset = *OffsetPtr;
  this->Depth = D;
  if ((this->Offset < UEndOffset) &&
     (bVar1 = DataExtractor::isValidOffset(&DebugInfoData->super_DataExtractor,this->Offset), bVar1)
     ) {
    uVar2 = DataExtractor::getULEB128(&DebugInfoData->super_DataExtractor,OffsetPtr,(Error *)0x0);
    if (uVar2 == 0) {
      this->AbbrevDecl = (DWARFAbbreviationDeclaration *)0x0;
      this_local._7_1_ = true;
    }
    else {
      FixedSize.Storage._8_8_ = DWARFUnit::getAbbreviations(U);
      if ((DWARFAbbreviationDeclarationSet *)FixedSize.Storage._8_8_ ==
          (DWARFAbbreviationDeclarationSet *)0x0) {
        this->AbbrevDecl = (DWARFAbbreviationDeclaration *)0x0;
      }
      else {
        pDVar3 = DWARFAbbreviationDeclarationSet::getAbbreviationDeclaration
                           ((DWARFAbbreviationDeclarationSet *)FixedSize.Storage._8_8_,
                            (uint32_t)uVar2);
        this->AbbrevDecl = pDVar3;
      }
      if (this->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0) {
        *OffsetPtr = this->Offset;
        this_local._7_1_ = false;
      }
      else {
        OVar8 = DWARFAbbreviationDeclaration::getFixedAttributesByteSize(this->AbbrevDecl,U);
        __range1 = (attr_iterator_range *)OVar8.Storage.field_0;
        FixedSize.Storage.field_0.empty = OVar8.Storage.hasVal;
        bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&__range1);
        if (bVar1) {
          puVar4 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&__range1);
          *OffsetPtr = *puVar4 + *OffsetPtr;
          this_local._7_1_ = true;
        }
        else {
          ___begin1 = DWARFAbbreviationDeclaration::attributes(this->AbbrevDecl);
          local_68 = (iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*> *)
                     &__begin1;
          __end1 = iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*>::begin
                             (local_68);
          pAVar5 = iterator_range<const_llvm::DWARFAbbreviationDeclaration::AttributeSpec_*>::end
                             (local_68);
          for (; __end1 != pAVar5; __end1 = __end1 + 1) {
            FixedSize_1.Storage._8_8_ = __end1;
            OVar9 = DWARFAbbreviationDeclaration::AttributeSpec::getByteSize(__end1,U);
            local_a0 = OVar9.Storage.field_0;
            FixedSize_1.Storage.field_0.empty = OVar9.Storage.hasVal;
            bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_a0.empty);
            if (bVar1) {
              plVar6 = Optional<long>::operator*((Optional<long> *)&local_a0);
              *OffsetPtr = *plVar6 + *OffsetPtr;
            }
            else {
              Form = *(Form *)(FixedSize_1.Storage._8_8_ + 2);
              DebugInfoData_00 = DebugInfoData->super_DataExtractor;
              pFVar7 = DWARFUnit::getFormParams(U);
              bVar1 = DWARFFormValue::skipValue(Form,DebugInfoData_00,OffsetPtr,*pFVar7);
              if (!bVar1) {
                *OffsetPtr = this->Offset;
                return false;
              }
            }
          }
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFDebugInfoEntry::extractFast(const DWARFUnit &U, uint64_t *OffsetPtr,
                                      const DWARFDataExtractor &DebugInfoData,
                                      uint64_t UEndOffset, uint32_t D) {
  Offset = *OffsetPtr;
  Depth = D;
  if (Offset >= UEndOffset || !DebugInfoData.isValidOffset(Offset))
    return false;
  uint64_t AbbrCode = DebugInfoData.getULEB128(OffsetPtr);
  if (0 == AbbrCode) {
    // NULL debug tag entry.
    AbbrevDecl = nullptr;
    return true;
  }
  if (auto* Abbreviations = U.getAbbreviations()) { // XXX BINARYEN
    AbbrevDecl = Abbreviations->getAbbreviationDeclaration(AbbrCode);
  } else {
    AbbrevDecl = nullptr; // XXX BINARYEN
  }
  if (nullptr == AbbrevDecl) {
    // Restore the original offset.
    *OffsetPtr = Offset;
    return false;
  }
  // See if all attributes in this DIE have fixed byte sizes. If so, we can
  // just add this size to the offset to skip to the next DIE.
  if (Optional<size_t> FixedSize = AbbrevDecl->getFixedAttributesByteSize(U)) {
    *OffsetPtr += *FixedSize;
    return true;
  }

  // Skip all data in the .debug_info for the attributes
  for (const auto &AttrSpec : AbbrevDecl->attributes()) {
    // Check if this attribute has a fixed byte size.
    if (auto FixedSize = AttrSpec.getByteSize(U)) {
      // Attribute byte size if fixed, just add the size to the offset.
      *OffsetPtr += *FixedSize;
    } else if (!DWARFFormValue::skipValue(AttrSpec.Form, DebugInfoData,
                                          OffsetPtr, U.getFormParams())) {
      // We failed to skip this attribute's value, restore the original offset
      // and return the failure status.
      *OffsetPtr = Offset;
      return false;
    }
  }
  return true;
}